

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O3

void read_filler_data_rbsp(h264_stream_t *h,bs_t *b)

{
  uint uVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t r;
  uint uVar6;
  byte *pbVar7;
  uint uVar8;
  bool bVar9;
  
  pbVar2 = b->p;
  uVar5 = b->bits_left;
  while( true ) {
    uVar6 = 0;
    iVar3 = 7;
    pbVar7 = pbVar2;
    uVar1 = uVar5;
    do {
      uVar8 = uVar1 - 1;
      uVar4 = 0;
      if (pbVar7 < b->end) {
        uVar4 = (uint)((*pbVar7 >> (uVar8 & 0x1f) & 1) != 0);
      }
      uVar1 = uVar8;
      if (uVar8 == 0) {
        uVar1 = 8;
      }
      pbVar7 = pbVar7 + (uVar8 == 0);
      uVar6 = uVar6 | uVar4 << ((byte)iVar3 & 0x1f);
      bVar9 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while (bVar9);
    if (uVar6 != 0xff) break;
    iVar3 = 8;
    do {
      uVar5 = uVar5 - 1;
      if (uVar5 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        uVar5 = 8;
      }
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    b->bits_left = uVar5;
  }
  read_rbsp_trailing_bits((h264_stream_t *)0x8,b);
  return;
}

Assistant:

void read_filler_data_rbsp(h264_stream_t* h, bs_t* b)
{
    while( bs_next_bits(b, 8) == 0xFF )
    {
        int ff_byte = bs_read_f(b,8);  // equal to 0xFF
    }
    read_rbsp_trailing_bits(h, b);
}